

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

sxi32 GenStateJSONObjectKeyNodeValidator(jx9_gen_state *pGen,jx9_expr_node *pRoot)

{
  ProcNodeConstruct p_Var1;
  SyToken *pSVar2;
  uint uVar3;
  sxi32 sVar4;
  uint uVar5;
  sxu32 nLine;
  undefined8 in_R8;
  undefined8 in_R9;
  
  p_Var1 = pRoot->xCode;
  uVar3 = 0;
  uVar5 = 0;
  if ((((p_Var1 != jx9CompileLiteral) && (uVar5 = uVar3, p_Var1 != jx9CompileSimpleString)) &&
      (p_Var1 != jx9CompileVariable)) && (p_Var1 != jx9CompileString)) {
    pSVar2 = pRoot->pStart;
    if (pSVar2 == (SyToken *)0x0) {
      nLine = 0;
    }
    else {
      nLine = pSVar2->nLine;
    }
    sVar4 = jx9GenCompileError(pGen,1,nLine,
                               "JSON Object: Unexpected expression, key must be of type string, literal or simple variable"
                               ,in_R8,in_R9,pSVar2);
    uVar5 = sVar4 == -10 ^ 0xfffffff7;
  }
  return uVar5;
}

Assistant:

static sxi32 GenStateJSONObjectKeyNodeValidator(jx9_gen_state *pGen,jx9_expr_node *pRoot)
{
	sxi32 rc = SXRET_OK;
	if( pRoot->xCode != jx9CompileVariable && pRoot->xCode != jx9CompileString 
		&& pRoot->xCode != jx9CompileSimpleString && pRoot->xCode != jx9CompileLiteral ){
		/* Unexpected expression */
		rc = jx9GenCompileError(&(*pGen), E_ERROR, pRoot->pStart? pRoot->pStart->nLine : 0, 
			"JSON Object: Unexpected expression, key must be of type string, literal or simple variable");
		if( rc != SXERR_ABORT ){
			rc = SXERR_INVALID;
		}
	}
	return rc;
}